

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O1

ssize_t __thiscall
SubdirsMetaMakefileGenerator::write
          (SubdirsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  Subdir *p;
  QArrayData *pQVar1;
  char (*pacVar2) [2];
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  uint uVar7;
  undefined8 unaff_RBP;
  ulong uVar8;
  undefined8 *puVar9;
  int iVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> local_d8;
  QString local_b0;
  QArrayData *local_98 [3];
  QArrayData *local_80;
  undefined8 *local_78;
  QArrayData *local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qmake_getpwd();
  QFile::fileName();
  if ((this->subs).d.size == 0) {
    uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  else {
    uVar11 = 0;
    do {
      qVar5 = local_e8;
      pcVar4 = pcStack_f0;
      pQVar3 = local_f8;
      p = (this->subs).d.ptr[uVar11];
      qmake_setpwd(&p->input_dir);
      QFileInfo::QFileInfo((QFileInfo *)&local_80,(QString *)&p->output_dir);
      QFileInfo::absoluteFilePath();
      pDVar6 = local_d8.b.d.d;
      pQVar1 = (QArrayData *)CONCAT44(Option::output_dir.d.d._4_4_,Option::output_dir.d.d._0_4_);
      pacVar2 = (char (*) [2])
                CONCAT44(Option::output_dir.d.ptr._4_4_,Option::output_dir.d.ptr._0_4_);
      Option::output_dir.d.d._0_4_ = local_d8.a.a._0_4_;
      Option::output_dir.d.d._4_4_ = local_d8.a.a._4_4_;
      Option::output_dir.d.ptr._0_4_ = local_d8.a.b._0_4_;
      Option::output_dir.d.ptr._4_4_ = local_d8.a.b._4_4_;
      local_d8.b.d.d = (Data *)Option::output_dir.d.size;
      Option::output_dir.d.size = (qsizetype)pDVar6;
      local_d8.a.a = (QString *)pQVar1;
      local_d8.a.b = pacVar2;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_80);
      QFile::setFileName((QString *)Option::output);
      if ((this->subs).d.size - 1U != uVar11) {
        if (0 < p->indent) {
          iVar10 = 0;
          do {
            putchar(0x20);
            iVar10 = iVar10 + 1;
          } while (iVar10 < p->indent);
        }
        QFile::fileName();
        local_d8.a.a = &Option::output_dir;
        local_d8.a.b = (char (*) [2])0x2a6ddb;
        local_f8 = (QArrayData *)0x0;
        pcStack_f0 = (char16_t *)0x0;
        local_d8.b.d.d = (Data *)pQVar3;
        local_d8.b.d.ptr = pcVar4;
        local_e8 = 0;
        local_d8.b.d.size = qVar5;
        QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::convertTo<QString>
                  (&local_b0,&local_d8);
        QDir::cleanPath((QString *)local_98);
        QString::toLatin1_helper_inplace((QString *)&local_80);
        puVar9 = local_78;
        if (local_78 == (undefined8 *)0x0) {
          puVar9 = &QByteArray::_empty;
        }
        printf("Writing %s\n",puVar9);
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80,1,0x10);
          }
        }
        if (local_98[0] != (QArrayData *)0x0) {
          LOCK();
          (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98[0],2,0x10);
          }
        }
        if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_d8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if (((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_d8.b.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      uVar7 = (*p->makefile->_vptr_MetaMakefileGenerator[4])();
      uVar8 = (ulong)uVar7;
      if ((char)uVar7 == '\0') break;
      qmake_setpwd(&local_50);
      QFile::setFileName((QString *)Option::output);
      QString::operator=(&Option::output_dir,(QString *)&Option::output_dir);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(this->subs).d.size);
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8 & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool
SubdirsMetaMakefileGenerator::write()
{
    bool ret = true;
    const QString &pwd = qmake_getpwd();
    const QString &output_dir = Option::output_dir;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < subs.size(); i++) {
        const Subdir *sub = subs.at(i);
        qmake_setpwd(sub->input_dir);
        Option::output_dir = QFileInfo(sub->output_dir).absoluteFilePath();
        Option::output.setFileName(sub->output_file);
        if(i != subs.size()-1) {
            for (int ind = 0; ind < sub->indent; ++ind)
                printf(" ");
            printf("Writing %s\n", QDir::cleanPath(Option::output_dir+"/"+
                                                   Option::output.fileName()).toLatin1().constData());
        }
        if (!(ret = sub->makefile->write()))
            break;
        //restore because I'm paranoid
        qmake_setpwd(pwd);
        Option::output.setFileName(output_name);
        Option::output_dir = output_dir;
    }
    return ret;
}